

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

Literal * wasm::Literal::makeFromInt64(Literal *__return_storage_ptr__,int64_t x,Type type)

{
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_20;
  
  if (type.id < 7) {
    switch((int)type.id) {
    case 2:
      (__return_storage_ptr__->field_0).i32 = (int32_t)x;
      (__return_storage_ptr__->type).id = 2;
      break;
    case 3:
      (__return_storage_ptr__->field_0).i64 = x;
      (__return_storage_ptr__->type).id = 3;
      break;
    case 4:
      *(float *)&__return_storage_ptr__->field_0 = (float)x;
      (__return_storage_ptr__->type).id = 4;
      break;
    case 5:
      *(double *)&__return_storage_ptr__->field_0 = (double)x;
      (__return_storage_ptr__->type).id = 5;
      break;
    case 6:
      local_38 = 3;
      local_30 = 0;
      local_20 = 3;
      local_48.i64 = x;
      Literal(__return_storage_ptr__,(LaneArray<2> *)&local_48.func);
      lVar1 = 0x18;
      do {
        ~Literal((Literal *)((long)&local_48 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      break;
    default:
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                         ,0xd4);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x1c4,"BasicType wasm::Type::getBasic() const");
}

Assistant:

static Literal makeFromInt64(int64_t x, Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(int32_t(x));
      case Type::i64:
        return Literal(int64_t(x));
      case Type::f32:
        return Literal(float(x));
      case Type::f64:
        return Literal(double(x));
      case Type::v128:
        return Literal(
          std::array<Literal, 2>{{Literal(x), Literal(int64_t(0))}});
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }